

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_f383c3::TestBuilder::TestBuilder
          (TestBuilder *this,CScript *script_,string *comment_,uint32_t flags_,bool P2SH,
          WitnessMode wm,int witnessversion,CAmount nValue_)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  TestBuilder *pTVar4;
  CScript *pCVar5;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar6;
  CSHA256 *this_00;
  uint256 *this_01;
  long in_FS_OFFSET;
  Span<unsigned_char> output;
  span<const_std::byte,_18446744073709551615UL> b;
  span<const_std::byte,_18446744073709551615UL> b_00;
  span<const_std::byte,_18446744073709551615UL> b_01;
  span<const_std::byte,_18446744073709551615UL> b_02;
  uint160 hash;
  uint256 hash_1;
  undefined1 local_c8 [32];
  pointer local_a8;
  pointer pCStack_a0;
  uchar local_98 [64];
  CScript scriptPubKey;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)this,&script_->super_CScriptBase);
  (this->scriptWitness).stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->creditTx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->scriptWitness).stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scriptWitness).stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)((long)&(this->witscript).super_CScriptBase._union + 0x10) = 0;
  *(undefined8 *)((long)&(this->witscript).super_CScriptBase._union + 0x18) = 0;
  (this->witscript).super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(this->witscript).super_CScriptBase._union + 8) = 0;
  *(undefined8 *)((long)&(this->redeemscript).super_CScriptBase._union + 0x10) = 0;
  *(undefined8 *)((long)&(this->redeemscript).super_CScriptBase._union + 0x18) = 0;
  (this->redeemscript).super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(this->redeemscript).super_CScriptBase._union + 8) = 0;
  (this->creditTx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CMutableTransaction::CMutableTransaction(&this->spendTx);
  this->havePush = false;
  (this->push).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->push).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->push).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&this->comment,comment_);
  this->flags = flags_;
  this->scriptError = 0;
  this->nValue = nValue_;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&scriptPubKey.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)this);
  if (wm == SH) {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&(this->witscript).super_CScriptBase,&scriptPubKey.super_CScriptBase);
    hash_1.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    CSHA256::CSHA256((CSHA256 *)local_c8);
    uVar1 = (this->witscript).super_CScriptBase._size;
    uVar3 = uVar1 - 0x1d;
    pCVar5 = (CScript *)(this->witscript).super_CScriptBase._union.indirect_contents.indirect;
    if (uVar1 < 0x1d) {
      uVar3 = uVar1;
      pCVar5 = &this->witscript;
    }
    this_00 = CSHA256::Write((CSHA256 *)local_c8,(uchar *)pCVar5,(ulong)uVar3);
    CSHA256::Finalize(this_00,(uchar *)&hash_1);
    local_c8._16_4_ = 0;
    local_c8._20_4_ = 0;
    local_c8._24_8_ = (pointer)0x0;
    local_c8._0_8_ = (char *)0x0;
    local_c8._8_4_ = 0;
    local_c8._12_4_ = 0;
    pCVar5 = CScript::push_int64((CScript *)local_c8,(ulong)(uint)witnessversion);
    ToByteVector<uint256>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&hash,&hash_1);
    b_01._M_extent._M_extent_value =
         hash.super_base_blob<160U>.m_data._M_elems._8_8_ -
         hash.super_base_blob<160U>.m_data._M_elems._0_8_;
    b_01._M_ptr = (pointer)hash.super_base_blob<160U>.m_data._M_elems._0_8_;
    ppVar6 = &CScript::operator<<(pCVar5,b_01)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&scriptPubKey.super_CScriptBase,ppVar6);
    this_01 = (uint256 *)&hash;
  }
  else {
    if (wm != PKH) goto LAB_004c5343;
    stack0xffffffffffffff08 = (pointer)((ulong)stack0xffffffffffffff08 & 0xffffffff00000000);
    hash.super_base_blob<160U>.m_data._M_elems[0] = '\0';
    hash.super_base_blob<160U>.m_data._M_elems[1] = '\0';
    hash.super_base_blob<160U>.m_data._M_elems[2] = '\0';
    hash.super_base_blob<160U>.m_data._M_elems[3] = '\0';
    hash.super_base_blob<160U>.m_data._M_elems[4] = '\0';
    hash.super_base_blob<160U>.m_data._M_elems[5] = '\0';
    hash.super_base_blob<160U>.m_data._M_elems[6] = '\0';
    hash.super_base_blob<160U>.m_data._M_elems[7] = '\0';
    hash.super_base_blob<160U>.m_data._M_elems[8] = '\0';
    hash.super_base_blob<160U>.m_data._M_elems[9] = '\0';
    hash.super_base_blob<160U>.m_data._M_elems[10] = '\0';
    hash.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
    hash.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
    hash.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
    hash.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
    hash.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
    local_98[0x20] = '\0';
    local_98[0x21] = '\0';
    local_98[0x22] = '\0';
    local_98[0x23] = '\0';
    local_98[0x24] = '\0';
    local_98[0x25] = '\0';
    local_98[0x26] = '\0';
    local_98[0x27] = '\0';
    local_98[0x28] = '\0';
    local_98[0x29] = '\0';
    local_98[0x2a] = '\0';
    local_98[0x2b] = '\0';
    local_98[0x2c] = '\0';
    local_98[0x2d] = '\0';
    local_98[0x2e] = '\0';
    local_98[0x2f] = '\0';
    local_98[0x10] = '\0';
    local_98[0x11] = '\0';
    local_98[0x12] = '\0';
    local_98[0x13] = '\0';
    local_98[0x14] = '\0';
    local_98[0x15] = '\0';
    local_98[0x16] = '\0';
    local_98[0x17] = '\0';
    local_98[0x18] = '\0';
    local_98[0x19] = '\0';
    local_98[0x1a] = '\0';
    local_98[0x1b] = '\0';
    local_98[0x1c] = '\0';
    local_98[0x1d] = '\0';
    local_98[0x1e] = '\0';
    local_98[0x1f] = '\0';
    local_98[0] = '\0';
    local_98[1] = '\0';
    local_98[2] = '\0';
    local_98[3] = '\0';
    local_98[4] = '\0';
    local_98[5] = '\0';
    local_98[6] = '\0';
    local_98[7] = '\0';
    local_98[8] = '\0';
    local_98[9] = '\0';
    local_98[10] = '\0';
    local_98[0xb] = '\0';
    local_98[0xc] = '\0';
    local_98[0xd] = '\0';
    local_98[0xe] = '\0';
    local_98[0xf] = '\0';
    local_a8 = (pointer)0x0;
    pCStack_a0 = (pointer)0x0;
    local_c8._16_4_ = 0;
    local_c8._20_4_ = 0;
    local_c8._24_8_ = (pointer)0x0;
    local_c8._0_8_ = (char *)0x0;
    local_c8._8_4_ = 0;
    local_c8._12_4_ = 0;
    local_98[0x30] = '\0';
    local_98[0x31] = '\0';
    local_98[0x32] = '\0';
    local_98[0x33] = '\0';
    local_98[0x34] = '\0';
    local_98[0x35] = '\0';
    local_98[0x36] = '\0';
    local_98[0x37] = '\0';
    CSHA256::CSHA256((CSHA256 *)local_c8);
    uVar1 = (this->script).super_CScriptBase._size;
    uVar3 = uVar1 - 0x1d;
    pTVar4 = (TestBuilder *)(this->script).super_CScriptBase._union.indirect_contents.indirect;
    if (uVar1 < 0x1d) {
      uVar3 = uVar1;
      pTVar4 = this;
    }
    CSHA256::Write((CSHA256 *)local_c8,
                   (uchar *)((pTVar4->script).super_CScriptBase._union.direct + 1),(ulong)uVar3 - 1)
    ;
    output.m_size = 0x14;
    output.m_data = (uchar *)&hash;
    CHash160::Finalize((CHash160 *)local_c8,output);
    local_c8._16_4_ = 0;
    local_c8._20_4_ = 0;
    local_c8._24_8_ = (pointer)0x0;
    local_c8._0_8_ = (char *)0x0;
    local_c8._8_4_ = 0;
    local_c8._12_4_ = 0;
    pCVar5 = CScript::operator<<((CScript *)local_c8,OP_DUP);
    pCVar5 = CScript::operator<<(pCVar5,OP_HASH160);
    ToByteVector<uint160>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&hash_1,&hash);
    b._M_extent._M_extent_value =
         hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ -
         hash_1.super_base_blob<256U>.m_data._M_elems._0_8_;
    b._M_ptr = (pointer)hash_1.super_base_blob<256U>.m_data._M_elems._0_8_;
    pCVar5 = CScript::operator<<(pCVar5,b);
    pCVar5 = CScript::operator<<(pCVar5,OP_EQUALVERIFY);
    ppVar6 = &CScript::operator<<(pCVar5,OP_CHECKSIG)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)this,ppVar6);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&hash_1);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_c8);
    local_c8._16_4_ = 0;
    local_c8._20_4_ = 0;
    local_c8._24_8_ = (pointer)0x0;
    local_c8._0_8_ = (char *)0x0;
    local_c8._8_4_ = 0;
    local_c8._12_4_ = 0;
    pCVar5 = CScript::push_int64((CScript *)local_c8,(ulong)(uint)witnessversion);
    ToByteVector<uint160>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&hash_1,&hash);
    b_00._M_extent._M_extent_value =
         hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ -
         hash_1.super_base_blob<256U>.m_data._M_elems._0_8_;
    b_00._M_ptr = (pointer)hash_1.super_base_blob<256U>.m_data._M_elems._0_8_;
    ppVar6 = &CScript::operator<<(pCVar5,b_00)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&scriptPubKey.super_CScriptBase,ppVar6);
    this_01 = &hash_1;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)this_01);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_c8);
LAB_004c5343:
  if (P2SH) {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&(this->redeemscript).super_CScriptBase,&scriptPubKey.super_CScriptBase);
    local_c8._16_4_ = 0;
    local_c8._20_4_ = 0;
    local_c8._24_8_ = (pointer)0x0;
    local_c8._0_8_ = (char *)0x0;
    local_c8._8_4_ = 0;
    local_c8._12_4_ = 0;
    pCVar5 = CScript::operator<<((CScript *)local_c8,OP_HASH160);
    CScriptID::CScriptID((CScriptID *)&hash,&this->redeemscript);
    ToByteVector<CScriptID>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&hash_1,(CScriptID *)&hash);
    b_02._M_extent._M_extent_value =
         hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ -
         hash_1.super_base_blob<256U>.m_data._M_elems._0_8_;
    b_02._M_ptr = (pointer)hash_1.super_base_blob<256U>.m_data._M_elems._0_8_;
    pCVar5 = CScript::operator<<(pCVar5,b_02);
    ppVar6 = &CScript::operator<<(pCVar5,OP_EQUAL)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&scriptPubKey.super_CScriptBase,ppVar6);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&hash_1);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  }
  BuildCreditingTransaction((CMutableTransaction *)local_c8,&scriptPubKey,(int)this->nValue);
  std::make_shared<CTransaction_const,CMutableTransaction>((CMutableTransaction *)&hash_1);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->creditTx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&hash_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (hash_1.super_base_blob<256U>.m_data._M_elems + 8));
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)local_c8);
  hash_1.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  stack0xffffffffffffff08 = (pointer)0x0;
  BuildSpendingTransaction
            ((CMutableTransaction *)local_c8,(CScript *)&hash_1,(CScriptWitness *)&hash,
             (this->creditTx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  CMutableTransaction::operator=(&this->spendTx,(CMutableTransaction *)local_c8);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)local_c8);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)&hash);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&hash_1);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptPubKey.super_CScriptBase);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

TestBuilder(const CScript& script_, const std::string& comment_, uint32_t flags_, bool P2SH = false, WitnessMode wm = WitnessMode::NONE, int witnessversion = 0, CAmount nValue_ = 0) : script(script_), comment(comment_), flags(flags_), nValue(nValue_)
    {
        CScript scriptPubKey = script;
        if (wm == WitnessMode::PKH) {
            uint160 hash;
            CHash160().Write(Span{script}.subspan(1)).Finalize(hash);
            script = CScript() << OP_DUP << OP_HASH160 << ToByteVector(hash) << OP_EQUALVERIFY << OP_CHECKSIG;
            scriptPubKey = CScript() << witnessversion << ToByteVector(hash);
        } else if (wm == WitnessMode::SH) {
            witscript = scriptPubKey;
            uint256 hash;
            CSHA256().Write(witscript.data(), witscript.size()).Finalize(hash.begin());
            scriptPubKey = CScript() << witnessversion << ToByteVector(hash);
        }
        if (P2SH) {
            redeemscript = scriptPubKey;
            scriptPubKey = CScript() << OP_HASH160 << ToByteVector(CScriptID(redeemscript)) << OP_EQUAL;
        }
        creditTx = MakeTransactionRef(BuildCreditingTransaction(scriptPubKey, nValue));
        spendTx = BuildSpendingTransaction(CScript(), CScriptWitness(), *creditTx);
    }